

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O2

int __thiscall sockpp::connector::connect(connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int __fd_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  socklen_t __len_00;
  uint uVar5;
  sockaddr *__addr_00;
  error_category *peVar6;
  int in_register_0000000c;
  int ret;
  int ret_00;
  undefined4 in_register_00000034;
  socket *this_00;
  undefined1 local_98 [16];
  error_category *peStack_88;
  int err_1;
  connector *local_78;
  undefined1 local_70 [16];
  error_category *local_60;
  error_code err;
  pollfd fds;
  
  this_00 = (socket *)CONCAT44(in_register_00000034,__fd);
  if (CONCAT44(in_register_0000000c,__len) == 0 || in_register_0000000c < 0) {
    connect(this,__fd,__addr,__len);
    goto LAB_00108102;
  }
  recreate((result<sockpp::none> *)this,(connector *)this_00,(sock_address *)__addr);
  if (*(int *)(this + 8) != 0) goto LAB_00108102;
  local_78 = this;
  iVar4 = (*this_00->_vptr_socket[4])(this_00);
  if ((char)iVar4 == '\0') {
    (*this_00->_vptr_socket[3])(local_98,this_00,1);
  }
  __fd_00 = this_00->handle_;
  __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x20))(__addr);
  __len_00 = (**(code **)(*(long *)__addr + 0x10))(__addr);
  uVar5 = ::connect(__fd_00,__addr_00,__len_00);
  socket::check_res<int,int>((result<int> *)local_98,(socket *)(ulong)uVar5,ret);
  if (local_98._8_4_ != 0) {
    err._0_8_ = local_98._8_8_;
    err._M_cat = peStack_88;
    peVar6 = (error_category *)std::_V2::generic_category();
    local_70._0_4_ = 0x73;
    local_70._8_8_ = peVar6;
    bVar3 = std::operator==(&err,(error_condition *)local_70);
    if (bVar3) {
LAB_0010805f:
      fds.fd = this_00->handle_;
      fds.events = 5;
      fds.revents = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = CONCAT44(in_register_0000000c,__len);
      uVar5 = poll((pollfd *)&fds,1,SUB164(auVar1 / ZEXT816(1000),0));
      socket::check_res<int,int>((result<int> *)local_70,(socket *)(ulong)uVar5,ret_00);
      peStack_88 = local_60;
      local_98._0_8_ = CONCAT44(local_70._4_4_,local_70._0_4_);
      local_98._8_8_ = local_70._8_8_;
      uVar2 = local_98._8_8_;
      local_98._8_4_ = (undefined4)local_70._8_8_;
      bVar3 = local_98._8_4_ == 0;
      local_98._8_8_ = uVar2;
      if (bVar3) {
        if ((int)local_70._0_4_ < 1) {
          local_98._0_8_ = (ulong)(uint)local_70._4_4_ << 0x20;
          local_98._12_4_ = SUB84(local_70._8_8_,4);
          local_98._8_4_ = 0x6e;
          peStack_88 = peVar6;
        }
        else {
          socket::get_option<int>((result<sockpp::none> *)local_70,this_00,1,4,&err_1);
          if (local_70._8_4_ == 0) {
            peStack_88 = (error_category *)std::_V2::system_category();
            local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
            local_98._8_4_ = err_1;
          }
        }
      }
    }
    else {
      fds.fd = 0xb;
      bVar3 = std::operator==(&err,(error_condition *)&fds);
      if (bVar3) goto LAB_0010805f;
    }
    if (local_98._8_4_ != 0) {
      (*this_00->_vptr_socket[5])(local_70,this_00);
      *(undefined8 *)(this + 8) = local_98._8_8_;
      *(error_category **)(this + 0x10) = peStack_88;
      this = local_78;
      goto LAB_00108102;
    }
  }
  if ((char)iVar4 == '\0') {
    (*this_00->_vptr_socket[3])(local_70,this_00,0);
  }
  std::error_code::error_code((error_code *)(this + 8));
  this = local_78;
LAB_00108102:
  return (int)this;
}

Assistant:

result<> connector::connect(const sock_address& addr, microseconds timeout) {
    if (timeout.count() <= 0)
        return connect(addr);

    if (auto res = recreate(addr); !res)
        return res;

    bool non_blocking =
#if defined(_WIN32)
        false;
#else
        is_non_blocking();
#endif

    if (!non_blocking)
        set_non_blocking(true);

    auto res = check_res(::connect(handle(), addr.sockaddr_ptr(), addr.size()));

    if (!res) {
        auto err = res.error();
        if (err == errc::operation_in_progress || err == errc::operation_would_block) {
// TODO: Windows has a WSAPoll() function we can use.
#if defined(_WIN32)
            // Non-blocking connect -- call `select` to wait until the timeout:
            // Note:  Windows returns errors in exceptset so check it too, the
            // logic afterwords doesn't change
            fd_set readset;
            FD_ZERO(&readset);
            FD_SET(handle(), &readset);
            fd_set writeset = readset;
            fd_set exceptset = readset;
            timeval tv = to_timeval(timeout);
            res =
                check_res(::select(int(handle()) + 1, &readset, &writeset, &exceptset, &tv));
#else
            pollfd fds = {handle(), POLLIN | POLLOUT, 0};
            int ms = int(duration_cast<milliseconds>(timeout).count());
            res = check_res(::poll(&fds, 1, ms));
#endif
            if (res) {
                if (res && res.value() > 0) {
                    // Got a socket event, but it might be an error, so check:
                    int err;
                    if (get_option(SOL_SOCKET, SO_ERROR, &err))
                        res = result<int>::from_error(err);
                }
                else {
                    res = errc::timed_out;
                }
            }
        }

        if (!res) {
            close();
            return res.error();
        }
    }

    // Restore blocking mode for socket, if needed.
    if (!non_blocking)
        set_non_blocking(false);

    return none{};
}